

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iterate.cc
# Opt level: O3

void __thiscall ipx::Iterate::Iterate(Iterate *this,Model *model)

{
  int iVar1;
  double *pdVar2;
  pointer pSVar3;
  double *pdVar4;
  double *pdVar5;
  double *pdVar6;
  double *pdVar7;
  StateDetail SVar8;
  uint uVar9;
  double *pdVar10;
  double dVar11;
  ulong uVar12;
  size_t sVar13;
  int iVar14;
  ulong __new_size;
  uint uVar15;
  uint uVar16;
  uint uVar17;
  uint uVar18;
  
  this->model_ = model;
  memset(&this->x_,0,0x102);
  this->feasibility_tol_ = 1e-06;
  this->optimality_tol_ = 1e-08;
  this->start_crossover_tol_ = -1.0;
  iVar1 = model->num_rows_;
  sVar13 = (size_t)iVar1;
  __new_size = (long)model->num_cols_ + sVar13;
  iVar14 = (int)__new_size;
  if (iVar14 != 0) {
    operator_delete((void *)0x0);
    (this->x_)._M_size = __new_size;
    pdVar10 = (double *)operator_new(__new_size * 8);
    (this->x_)._M_data = pdVar10;
    memset(pdVar10,0,__new_size * 8);
  }
  pdVar10 = (this->xl_)._M_data;
  if ((this->xl_)._M_size != __new_size) {
    operator_delete(pdVar10);
    (this->xl_)._M_size = __new_size;
    pdVar10 = (double *)operator_new(__new_size * 8);
    (this->xl_)._M_data = pdVar10;
  }
  if (iVar14 != 0) {
    memset(pdVar10,0,__new_size * 8);
  }
  pdVar10 = (this->xu_)._M_data;
  if ((this->xu_)._M_size != __new_size) {
    operator_delete(pdVar10);
    (this->xu_)._M_size = __new_size;
    pdVar10 = (double *)operator_new(__new_size * 8);
    (this->xu_)._M_data = pdVar10;
  }
  if (iVar14 != 0) {
    memset(pdVar10,0,__new_size * 8);
  }
  pdVar10 = (this->y_)._M_data;
  if ((this->y_)._M_size != sVar13) {
    operator_delete(pdVar10);
    (this->y_)._M_size = sVar13;
    pdVar10 = (double *)operator_new(sVar13 * 8);
    (this->y_)._M_data = pdVar10;
  }
  if (iVar1 != 0) {
    memset(pdVar10,0,sVar13 * 8);
  }
  pdVar10 = (this->zl_)._M_data;
  if ((this->zl_)._M_size != __new_size) {
    operator_delete(pdVar10);
    (this->zl_)._M_size = __new_size;
    pdVar10 = (double *)operator_new(__new_size * 8);
    (this->zl_)._M_data = pdVar10;
  }
  if (iVar14 != 0) {
    memset(pdVar10,0,__new_size * 8);
  }
  pdVar10 = (this->zu_)._M_data;
  if ((this->zu_)._M_size != __new_size) {
    operator_delete(pdVar10);
    (this->zu_)._M_size = __new_size;
    pdVar10 = (double *)operator_new(__new_size * 8);
    (this->zu_)._M_data = pdVar10;
  }
  if (iVar14 != 0) {
    memset(pdVar10,0,__new_size * 8);
  }
  pdVar10 = (this->rb_)._M_data;
  if ((this->rb_)._M_size != sVar13) {
    operator_delete(pdVar10);
    (this->rb_)._M_size = sVar13;
    pdVar10 = (double *)operator_new(sVar13 * 8);
    (this->rb_)._M_data = pdVar10;
  }
  if (iVar1 != 0) {
    memset(pdVar10,0,sVar13 << 3);
  }
  pdVar10 = (this->rl_)._M_data;
  if ((this->rl_)._M_size != __new_size) {
    operator_delete(pdVar10);
    (this->rl_)._M_size = __new_size;
    pdVar10 = (double *)operator_new(__new_size * 8);
    (this->rl_)._M_data = pdVar10;
  }
  if (iVar14 != 0) {
    memset(pdVar10,0,__new_size * 8);
  }
  pdVar10 = (this->ru_)._M_data;
  if ((this->ru_)._M_size != __new_size) {
    operator_delete(pdVar10);
    (this->ru_)._M_size = __new_size;
    pdVar10 = (double *)operator_new(__new_size * 8);
    (this->ru_)._M_data = pdVar10;
  }
  if (iVar14 != 0) {
    memset(pdVar10,0,__new_size * 8);
  }
  pdVar10 = (this->rc_)._M_data;
  if ((this->rc_)._M_size != __new_size) {
    operator_delete(pdVar10);
    (this->rc_)._M_size = __new_size;
    pdVar10 = (double *)operator_new(__new_size * 8);
    (this->rc_)._M_data = pdVar10;
  }
  if (iVar14 != 0) {
    memset(pdVar10,0,__new_size * 8);
  }
  std::vector<ipx::Iterate::StateDetail,_std::allocator<ipx::Iterate::StateDetail>_>::resize
            (&this->variable_state_,__new_size);
  if (0 < iVar14) {
    pdVar10 = (model->lb_)._M_data;
    pdVar2 = (model->ub_)._M_data;
    pSVar3 = (this->variable_state_).
             super__Vector_base<ipx::Iterate::StateDetail,_std::allocator<ipx::Iterate::StateDetail>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pdVar4 = (this->xl_)._M_data;
    pdVar5 = (this->xu_)._M_data;
    pdVar6 = (this->zl_)._M_data;
    pdVar7 = (this->zu_)._M_data;
    uVar12 = 0;
    uVar15 = 0x3ff00000;
    do {
      dVar11 = ABS(pdVar2[uVar12]);
      uVar16 = uVar15;
      uVar9 = uVar15;
      if (0x7fefffffffffffff < (ulong)dVar11) {
        uVar16 = 0;
        uVar9 = 0x7ff00000;
      }
      SVar8 = (uint)((ulong)dVar11 < 0x7ff0000000000000) * 2;
      uVar17 = uVar15;
      uVar18 = uVar15;
      if (0x7fefffffffffffff < (ulong)ABS(pdVar10[uVar12])) {
        uVar17 = 0x7ff00000;
        uVar18 = 0;
        SVar8 = (uint)(0x7fefffffffffffff < (ulong)dVar11) * 2 + BARRIER_UB;
      }
      pSVar3[uVar12] = SVar8;
      pdVar4[uVar12] = (double)((ulong)uVar17 << 0x20);
      pdVar5[uVar12] = (double)((ulong)uVar9 << 0x20);
      pdVar6[uVar12] = (double)((ulong)uVar18 << 0x20);
      pdVar7[uVar12] = (double)((ulong)uVar16 << 0x20);
      uVar12 = uVar12 + 1;
    } while ((__new_size & 0xffffffff) != uVar12);
  }
  return;
}

Assistant:

Iterate::Iterate(const Model& model) : model_(model) {
    const Int m = model_.rows();
    const Int n = model_.cols();
    const Vector& lb = model.lb();
    const Vector& ub = model.ub();
    x_.resize(n+m);
    xl_.resize(n+m);
    xu_.resize(n+m);
    y_.resize(m);
    zl_.resize(n+m);
    zu_.resize(n+m);
    rb_.resize(m);
    rl_.resize(n+m);
    ru_.resize(n+m);
    rc_.resize(n+m);
    variable_state_.resize(n+m);

    for (Int j = 0; j < n+m; j++) {
        if (std::isfinite(lb[j]) && std::isfinite(ub[j])) {
            variable_state_[j] = StateDetail::BARRIER_BOXED;
            xl_[j] = 1.0;
            xu_[j] = 1.0;
            zl_[j] = 1.0;
            zu_[j] = 1.0;
        } else if (std::isfinite(lb[j])) {
            variable_state_[j] = StateDetail::BARRIER_LB;
            xl_[j] = 1.0;
            xu_[j] = INFINITY;
            zl_[j] = 1.0;
            zu_[j] = 0.0;
        } else if (std::isfinite(ub[j])) {
            variable_state_[j] = StateDetail::BARRIER_UB;
            xl_[j] = INFINITY;
            xu_[j] = 1.0;
            zl_[j] = 0.0;
            zu_[j] = 1.0;
        } else {
            variable_state_[j] = StateDetail::FREE;
            xl_[j] = INFINITY;
            xu_[j] = INFINITY;
            zl_[j] = 0.0;
            zu_[j] = 0.0;
        }
    }
    assert_consistency();
}